

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void leveldb::AppendEscapedStringTo(string *str,Slice *value)

{
  ulong uVar1;
  size_t sVar2;
  char local_2b [8];
  char buf [10];
  char c;
  size_t i;
  Slice *value_local;
  string *str_local;
  
  stack0xffffffffffffffe0 = 0;
  while( true ) {
    uVar1 = stack0xffffffffffffffe0;
    sVar2 = Slice::size(value);
    if (sVar2 <= uVar1) break;
    buf[2] = Slice::operator[](value,stack0xffffffffffffffe0);
    if ((buf[2] < ' ') || ('~' < buf[2])) {
      snprintf(local_2b,10,"\\x%02x",(ulong)(byte)buf[2]);
      std::__cxx11::string::append((char *)str);
    }
    else {
      std::__cxx11::string::push_back((char)str);
    }
    register0x00000000 = stack0xffffffffffffffe0 + 1;
  }
  return;
}

Assistant:

void AppendEscapedStringTo(std::string* str, const Slice& value) {
  for (size_t i = 0; i < value.size(); i++) {
    char c = value[i];
    if (c >= ' ' && c <= '~') {
      str->push_back(c);
    } else {
      char buf[10];
      std::snprintf(buf, sizeof(buf), "\\x%02x",
                    static_cast<unsigned int>(c) & 0xff);
      str->append(buf);
    }
  }
}